

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2xor.hpp
# Opt level: O0

void __thiscall
trng::lagfib2xor<unsigned_long,_168U,_521U>::discard
          (lagfib2xor<unsigned_long,_168U,_521U> *this,unsigned_long_long n)

{
  GF2 a;
  value_type vVar1;
  unsigned_long_long uVar2;
  reference pvVar3;
  reference pvVar4;
  type_conflict3 tVar5;
  ulong in_RSI;
  lagfib2xor<unsigned_long,_168U,_521U> *in_RDI;
  unsigned_long_long i_4;
  size_type i_3;
  size_type k;
  result_type sum;
  size_type i_2;
  vector_type W;
  size_type i_1;
  vector_type V;
  size_type i;
  matrix_type M;
  unsigned_long_long n_partial;
  uint mask;
  unsigned_long_long n_pivot;
  uint matrix_size;
  matrix<trng::GF2,_521UL> *in_stack_fffffffffffffea8;
  matrix<trng::GF2,_521UL> *in_stack_fffffffffffffeb0;
  matrix<trng::GF2,_521UL> *in_stack_fffffffffffffed0;
  matrix<trng::GF2,_521UL> *in_stack_ffffffffffffff18;
  ulong uVar6;
  ulong local_e0;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_a0;
  GF2 local_66;
  GF2 local_65 [20];
  GF2 local_51;
  ulong local_50;
  long local_30;
  undefined4 local_24;
  ulong local_20;
  undefined4 local_14;
  ulong local_10;
  
  local_14 = 0x209;
  local_10 = in_RSI;
  uVar2 = int_math::log2_ceil<unsigned_long_long>((unsigned_long_long)in_stack_fffffffffffffeb0);
  local_20 = uVar2 * 0x86de8d9;
  local_24 = 0x3ff;
  if (local_20 < local_10) {
    local_30 = local_10 - 0x209;
    matrix<trng::GF2,_521UL>::matrix(in_stack_fffffffffffffed0);
    for (local_50 = 0; local_50 < 0x208; local_50 = local_50 + 1) {
      GF2::GF2(&local_51,true);
      pvVar3 = matrix<trng::GF2,_521UL>::operator()
                         (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8,0x2cbf06);
      pvVar3->value = local_51.value;
    }
    GF2::GF2(local_65,true);
    pvVar3 = matrix<trng::GF2,_521UL>::operator()
                       (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8,0x2cbf74);
    pvVar3->value = local_65[0].value;
    GF2::GF2(&local_66,true);
    pvVar3 = matrix<trng::GF2,_521UL>::operator()
                       (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8,0x2cbfb4);
    pvVar3->value = local_66.value;
    power<trng::GF2,521ul>(in_stack_ffffffffffffff18,(unsigned_long_long)in_RDI);
    matrix<trng::GF2,_521UL>::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    matrix<trng::GF2,_521UL>::~matrix((matrix<trng::GF2,_521UL> *)0x2cc00c);
    vector<unsigned_long,_521UL>::vector((vector<unsigned_long,_521UL> *)in_stack_fffffffffffffed0);
    for (local_a0 = 0; local_a0 < 0x209; local_a0 = local_a0 + 1) {
      vVar1 = (in_RDI->S).r[(in_RDI->S).index - (int)local_a0 & 0x3ff];
      pvVar4 = vector<unsigned_long,_521UL>::operator()
                         ((vector<unsigned_long,_521UL> *)in_stack_fffffffffffffeb0,
                          (size_type)in_stack_fffffffffffffea8);
      *pvVar4 = vVar1;
    }
    vector<unsigned_long,_521UL>::vector((vector<unsigned_long,_521UL> *)in_stack_fffffffffffffed0);
    for (local_c0 = 0; local_c0 < 0x209; local_c0 = local_c0 + 1) {
      local_c8 = 0;
      for (local_d0 = 0; local_d0 < 0x209; local_d0 = local_d0 + 1) {
        pvVar3 = matrix<trng::GF2,_521UL>::operator()
                           (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8,0x2cc127)
        ;
        a.value = pvVar3->value;
        pvVar4 = vector<unsigned_long,_521UL>::operator()
                           ((vector<unsigned_long,_521UL> *)in_stack_fffffffffffffeb0,
                            (size_type)in_stack_fffffffffffffea8);
        tVar5 = trng::operator*(a,*pvVar4);
        local_c8 = tVar5 ^ local_c8;
      }
      pvVar4 = vector<unsigned_long,_521UL>::operator()
                         ((vector<unsigned_long,_521UL> *)in_stack_fffffffffffffeb0,
                          (size_type)in_stack_fffffffffffffea8);
      *pvVar4 = local_c8;
    }
    (in_RDI->S).index = (in_RDI->S).index + (int)local_30;
    (in_RDI->S).index = (in_RDI->S).index & 0x3ff;
    for (local_e0 = 0; local_e0 < 0x209; local_e0 = local_e0 + 1) {
      in_stack_fffffffffffffeb0 =
           (matrix<trng::GF2,_521UL> *)
           vector<unsigned_long,_521UL>::operator()
                     ((vector<unsigned_long,_521UL> *)in_stack_fffffffffffffeb0,
                      (size_type)in_stack_fffffffffffffea8);
      (in_RDI->S).r[(in_RDI->S).index - local_e0 & 0x3ff] =
           (result_type)
           (in_stack_fffffffffffffeb0->data).
           super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.super__Vector_impl_data
           ._M_start;
    }
    local_10 = local_10 - local_30;
    vector<unsigned_long,_521UL>::~vector((vector<unsigned_long,_521UL> *)0x2cc2d2);
    vector<unsigned_long,_521UL>::~vector((vector<unsigned_long,_521UL> *)0x2cc2df);
    matrix<trng::GF2,_521UL>::~matrix((matrix<trng::GF2,_521UL> *)0x2cc2ec);
  }
  for (uVar6 = 0; uVar6 < local_10; uVar6 = uVar6 + 1) {
    step(in_RDI);
  }
  return;
}

Assistant:

void discard(unsigned long long n) {
      const unsigned int matrix_size = B;
      using matrix_type = matrix<GF2, matrix_size>;
      using vector_type = vector<result_type, matrix_size>;
      using size_type = typename matrix_type::size_type;
      const unsigned long long n_pivot{int_math::log2_ceil(n) * B * B * B};
      constexpr auto mask = int_math::mask(B);
      if (n > n_pivot) {
        const unsigned long long n_partial{n - matrix_size};
        matrix_type M;
        for (size_type i{0}; i < matrix_size - 1; ++i)
          M(i, i + 1) = GF2(true);
        M(matrix_size - 1, matrix_size - B) = GF2(true);
        M(matrix_size - 1, matrix_size - A) = GF2(true);
        M = power(M, n_partial);
        vector_type V;
        for (size_type i{0}; i < matrix_size; ++i)
          V(matrix_size - 1 - i) = S.r[(S.index - i) & mask];
        vector_type W;
        for (size_type i{0}; i < matrix_size; ++i) {
          result_type sum{};
          for (size_type k{0}; k < matrix_size; ++k)
            sum ^= M(i, k) * V(k);
          W(i) = sum;
        }
        S.index = static_cast<unsigned int>(S.index + n_partial);
        S.index &= mask;
        for (size_type i{0}; i < matrix_size; ++i)
          S.r[(S.index - i) & mask] = W(matrix_size - 1 - i);
        n -= n_partial;
      }
      for (unsigned long long i{0}; i < n; ++i)
        step();
    }